

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

string * __thiscall
xLearn::Reader::check_file_format_abi_cxx11_(string *__return_storage_ptr__,Reader *this)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  FILE *file;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  size_type sVar13;
  ushort uVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string data_line;
  Logger local_8c;
  string local_88;
  string local_68;
  string local_48;
  undefined1 auVar15 [16];
  
  local_88._M_string_length = (size_type)local_88._M_dataplus._M_p;
  file = OpenFileOrDie((this->filename_)._M_dataplus._M_p,"r");
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  GetLine(file,&local_48);
  Close(file);
  if (local_48._M_string_length == 0) {
LAB_0013ab48:
    local_8c.severity_ = FATAL;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader.cc"
               ,"");
    local_88._M_dataplus._M_p = (pointer)((long)&local_88 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"check_file_format","");
    poVar7 = Logger::Start(FATAL,&local_68,0x4d,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"File format error!",0x12);
    if (local_88._M_dataplus._M_p != (pointer)((long)&local_88 + 0x10)) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    Logger::~Logger(&local_8c);
  }
  else {
    sVar13 = 0;
    iVar6 = 0;
    iVar9 = 0;
    iVar11 = 0;
    do {
      cVar1 = local_48._M_dataplus._M_p[sVar13];
      if (cVar1 == '\t') {
        iVar9 = iVar9 + 1;
      }
      else if (cVar1 == ' ') {
        iVar11 = iVar11 + 1;
      }
      else {
        iVar6 = iVar6 + (uint)(cVar1 == ',');
      }
      sVar13 = sVar13 + 1;
    } while (local_48._M_string_length != sVar13);
    if ((iVar9 < iVar11) && (iVar6 < iVar11)) {
      pcVar10 = " ";
    }
    else if ((iVar11 < iVar9) && (iVar6 < iVar9)) {
      pcVar10 = "\t";
    }
    else {
      if (iVar6 <= iVar9 || iVar6 <= iVar11) goto LAB_0013ab48;
      pcVar10 = ",";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->splitor_,0,(char *)(this->splitor_)._M_string_length,(ulong)pcVar10);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  SplitStringUsing(&local_48,(this->splitor_)._M_dataplus._M_p,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88);
  lVar8 = std::__cxx11::string::find(local_88._M_dataplus._M_p,0x159db4,0);
  this->has_label_ = lVar8 == -1;
  if (*(long *)(local_88._M_dataplus._M_p + 0x28) != 0) {
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23[8] = 0x3a;
    auVar23._0_8_ = 0x3a3a3a3a3a3a3a3a;
    auVar23[9] = 0x3a;
    auVar23[10] = 0x3a;
    auVar23[0xb] = 0x3a;
    auVar23[0xc] = 0x3a;
    auVar23[0xd] = 0x3a;
    auVar23[0xe] = 0x3a;
    auVar23[0xf] = 0x3a;
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = vpbroadcastq_avx512f();
    uVar12 = 0;
    do {
      auVar21 = vpbroadcastq_avx512f();
      auVar22 = vmovdqa64_avx512f(auVar24);
      auVar24 = vporq_avx512f(auVar21,auVar18);
      auVar21 = vporq_avx512f(auVar21,auVar19);
      uVar3 = vpcmpuq_avx512f(auVar21,auVar20,2);
      bVar4 = (byte)uVar3;
      uVar3 = vpcmpuq_avx512f(auVar24,auVar20,2);
      bVar5 = (byte)uVar3;
      uVar14 = CONCAT11(bVar5,bVar4);
      auVar15 = vmovdqu8_avx512vl(*(undefined1 (*) [16])
                                   (*(long *)(local_88._M_dataplus._M_p + 0x20) + uVar12));
      auVar16[1] = ((byte)(uVar14 >> 1) & 1) * auVar15[1];
      auVar16[0] = (bVar4 & 1) * auVar15[0];
      auVar16[2] = ((byte)(uVar14 >> 2) & 1) * auVar15[2];
      auVar16[3] = ((byte)(uVar14 >> 3) & 1) * auVar15[3];
      auVar16[4] = ((byte)(uVar14 >> 4) & 1) * auVar15[4];
      auVar16[5] = ((byte)(uVar14 >> 5) & 1) * auVar15[5];
      auVar16[6] = ((byte)(uVar14 >> 6) & 1) * auVar15[6];
      auVar16[7] = ((byte)(uVar14 >> 7) & 1) * auVar15[7];
      auVar16[8] = (bVar5 & 1) * auVar15[8];
      auVar16[9] = (bVar5 >> 1 & 1) * auVar15[9];
      auVar16[10] = (bVar5 >> 2 & 1) * auVar15[10];
      auVar16[0xb] = (bVar5 >> 3 & 1) * auVar15[0xb];
      auVar16[0xc] = (bVar5 >> 4 & 1) * auVar15[0xc];
      auVar16[0xd] = (bVar5 >> 5 & 1) * auVar15[0xd];
      auVar16[0xe] = (bVar5 >> 6 & 1) * auVar15[0xe];
      auVar16[0xf] = -((char)bVar5 >> 7) * auVar15[0xf];
      uVar12 = uVar12 + 0x10;
      uVar3 = vpcmpeqb_avx512vl(auVar16,auVar23);
      auVar24 = vpmovm2d_avx512dq(uVar3);
      auVar24 = vpsubd_avx512f(auVar22,auVar24);
    } while ((*(long *)(local_88._M_dataplus._M_p + 0x28) + 0xfU & 0xfffffffffffffff0) != uVar12);
    auVar18 = vmovdqa32_avx512f(auVar24);
    auVar19._0_4_ = (uint)(bVar4 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar22._0_4_;
    bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar2 * auVar18._4_4_ | (uint)!bVar2 * auVar22._4_4_;
    bVar2 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar2 * auVar18._8_4_ | (uint)!bVar2 * auVar22._8_4_;
    bVar2 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar2 * auVar18._12_4_ | (uint)!bVar2 * auVar22._12_4_;
    bVar2 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar2 * auVar18._16_4_ | (uint)!bVar2 * auVar22._16_4_;
    bVar2 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar2 * auVar18._20_4_ | (uint)!bVar2 * auVar22._20_4_;
    bVar2 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar2 * auVar18._24_4_ | (uint)!bVar2 * auVar22._24_4_;
    bVar2 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar2 * auVar18._28_4_ | (uint)!bVar2 * auVar22._28_4_;
    auVar19._32_4_ = (uint)(bVar5 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar22._32_4_;
    bVar2 = (bool)(bVar5 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar2 * auVar18._36_4_ | (uint)!bVar2 * auVar22._36_4_;
    bVar2 = (bool)(bVar5 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar2 * auVar18._40_4_ | (uint)!bVar2 * auVar22._40_4_;
    bVar2 = (bool)(bVar5 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar2 * auVar18._44_4_ | (uint)!bVar2 * auVar22._44_4_;
    bVar2 = (bool)(bVar5 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar2 * auVar18._48_4_ | (uint)!bVar2 * auVar22._48_4_;
    bVar2 = (bool)(bVar5 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar2 * auVar18._52_4_ | (uint)!bVar2 * auVar22._52_4_;
    bVar2 = (bool)(bVar5 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar2 * auVar18._56_4_ | (uint)!bVar2 * auVar22._56_4_;
    auVar19._60_4_ =
         (uint)(bVar5 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar22._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpaddd_avx512f(auVar19,ZEXT3264(auVar17));
    auVar23 = vpaddd_avx(auVar18._0_16_,auVar18._16_16_);
    auVar15 = vpshufd_avx(auVar23,0xee);
    auVar23 = vpaddd_avx(auVar23,auVar15);
    auVar15 = vpshufd_avx(auVar23,0x55);
    auVar23 = vpaddd_avx(auVar23,auVar15);
    iVar6 = auVar23._0_4_;
    if (iVar6 != 0) {
      if (iVar6 == 2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"libffm","");
      }
      else {
        if (iVar6 != 1) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Unknow file format","");
          Color::print_error(&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          exit(0);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"libsvm","");
      }
      goto LAB_0013ad70;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"csv","");
LAB_0013ad70:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Reader::check_file_format() {
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename_.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(filename_.c_str(), "rb");
#endif
  // get the first line of data
  std::string data_line;
  GetLine(file, data_line);
  Close(file);
  // Find the split string
  int space_count = 0;
  int table_count = 0;
  int comma_count = 0;
  for (size_t i = 0; i < data_line.size(); ++i) {
    if (data_line[i] == ' ') {
      space_count++;
    } else if (data_line[i] == '\t') {
      table_count++;
    } else if (data_line[i] == ',') {
      comma_count++;
    }
  }
  if (space_count > table_count && 
      space_count > comma_count) {
    splitor_ = " ";
  } else if (table_count > space_count &&
             table_count > comma_count) {
    splitor_ = "\t";
  } else if (comma_count > space_count &&
             comma_count > table_count) {
    splitor_ = ",";
  } else {
    LOG(FATAL) << "File format error!";
  }
  // Split the first line of data
  std::vector<std::string> str_list;
  SplitStringUsing(data_line, splitor_.c_str(), &str_list);
  // has y?
  size_t found = str_list[0].find(":");
  if (found != std::string::npos) {  // find ":", no label
    has_label_ = false;
  } else {
    has_label_ = true;
  }
  // check file format
  int count = 0;
  for (int i = 0; i < str_list[1].size(); ++i) {
    if (str_list[1][i] == ':') {
      count++;
    }
  }
  if (count == 1) {
    return "libsvm";
  } else if (count == 2) {
    return "libffm";
  } else if (count == 0){
    return "csv";
  }
  Color::print_error("Unknow file format");
  exit(0);
}